

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

int Dsd_TreeCollectDecomposableVars_rec(DdManager *dd,Dsd_Node_t *pNode,int *pVars,int *nVars)

{
  short sVar1;
  Dsd_Type_t DVar2;
  DdNode *pDVar3;
  bool bVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  
  if (dd == (DdManager *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,500,
                  "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)"
                 );
  }
  if (((ulong)dd & 1) == 0) {
    if (1 < *(short *)((long)&(dd->sentinel).Id + 4)) {
      lVar8 = 0;
      bVar4 = false;
      do {
        iVar5 = Dsd_TreeCollectDecomposableVars_rec
                          ((DdManager *)
                           (*(ulong *)(&((dd->sentinel).type.kids.E)->index + lVar8 * 2) &
                           0xfffffffffffffffe),pNode,pVars,nVars);
        if (iVar5 != 0) {
          bVar4 = true;
        }
        lVar8 = lVar8 + 1;
        sVar1 = *(short *)((long)&(dd->sentinel).Id + 4);
        nVars = (int *)(long)sVar1;
      } while (lVar8 < (long)nVars);
      if (bVar4) {
        return 1;
      }
      if ((4 < sVar1) && (1 < (dd->sentinel).index - 3)) {
        return 1;
      }
      if (0 < sVar1) {
        pDVar3 = (dd->sentinel).type.kids.E;
        piVar6 = (int *)0x0;
        do {
          piVar7 = (int *)(*(ulong *)(&pDVar3->index + (long)piVar6 * 2) & 0xfffffffffffffffe);
          if (*piVar7 == 2) {
            if (pNode == (Dsd_Node_t *)0x0) {
              *pVars = *pVars + 1;
            }
            else {
              DVar2 = **(Dsd_Type_t **)(piVar7 + 4);
              iVar5 = *pVars;
              *pVars = iVar5 + 1;
              (&pNode->Type)[iVar5] = DVar2;
            }
          }
          piVar6 = (int *)((long)piVar6 + 1);
        } while (nVars != piVar6);
      }
    }
    return 0;
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                ,0x1f5,
                "int Dsd_TreeCollectDecomposableVars_rec(DdManager *, Dsd_Node_t *, int *, int *)");
}

Assistant:

int Dsd_TreeCollectDecomposableVars_rec( DdManager * dd, Dsd_Node_t * pNode, int * pVars, int * nVars )
{
    int fSkipThisNode, i;
    Dsd_Node_t * pTemp;
    int fVerbose = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );

    if ( pNode->nDecs <= 1 )
        return 0;

    // go through the list of successors and call recursively 
    fSkipThisNode = 0;
    for ( i = 0; i < pNode->nDecs; i++ )
        if ( Dsd_TreeCollectDecomposableVars_rec(dd, Dsd_Regular(pNode->pDecs[i]), pVars, nVars) )
            fSkipThisNode = 1;

    if ( !fSkipThisNode && (pNode->Type == DSD_NODE_OR || pNode->Type == DSD_NODE_EXOR || pNode->nDecs <= 4) )
    {
if ( fVerbose )
printf( "Node of type <%d> (OR=6,EXOR=8,RAND=1): ", pNode->Type );

        for ( i = 0; i < pNode->nDecs; i++ )
        {
            pTemp = Dsd_Regular(pNode->pDecs[i]);
            if ( pTemp->Type == DSD_NODE_BUF )
            {
                if ( pVars )
                    pVars[ (*nVars)++ ] = pTemp->S->index;
                else
                    (*nVars)++;
                    
if ( fVerbose )
printf( "%d ", pTemp->S->index );
            }
        }
if ( fVerbose )
printf( "\n" );
    }
    else
        fSkipThisNode = 1;


    return fSkipThisNode;
}